

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArray<short,_false,_false>::DirectSetItem
          (TypedArray<short,_false,_false> *this,uint32 index,Var value)

{
  BOOL BVar1;
  Var value_local;
  uint32 index_local;
  TypedArray<short,_false,_false> *this_local;
  
  BVar1 = BaseTypedDirectSetItem(this,index,value,JavascriptConversion::ToInt16);
  return BVar1;
}

Assistant:

inline BOOL Int16Array::DirectSetItem(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItem(index, value, JavascriptConversion::ToInt16);
    }